

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# singly_linked_list.cpp
# Opt level: O0

SinglyNodeWithRand *
si9ma::SinglyLinkedList::common_loop_intersection
          (SinglyNodeWithRand *head1,SinglyNodeWithRand *head2,SinglyNodeWithRand *list_terminal)

{
  SinglyNodeWithRand *pSVar1;
  SinglyNodeWithRand *local_58;
  SinglyNodeWithRand *local_50;
  int local_44;
  SinglyNodeWithRand *pSStack_40;
  int diff;
  SinglyNodeWithRand *short_list;
  SinglyNodeWithRand *long_list;
  SinglyNodeWithRand *ptr;
  int len;
  SinglyNodeWithRand *list_terminal_local;
  SinglyNodeWithRand *head2_local;
  SinglyNodeWithRand *head1_local;
  
  ptr._4_4_ = 0;
  for (long_list = head1; pSVar1 = head2, long_list != list_terminal; long_list = long_list->next) {
    ptr._4_4_ = ptr._4_4_ + 1;
  }
  while (long_list = pSVar1, long_list != list_terminal) {
    ptr._4_4_ = ptr._4_4_ + -1;
    pSVar1 = long_list->next;
  }
  local_50 = head2;
  if (0 < ptr._4_4_) {
    local_50 = head1;
  }
  short_list = local_50;
  local_58 = head1;
  if (0 < ptr._4_4_) {
    local_58 = head2;
  }
  pSStack_40 = local_58;
  local_44 = ptr._4_4_;
  if (ptr._4_4_ < 1) {
    local_44 = -ptr._4_4_;
  }
  while (0 < local_44) {
    short_list = short_list->next;
    local_44 = local_44 + -1;
  }
  for (; short_list != pSStack_40; short_list = short_list->next) {
    pSStack_40 = pSStack_40->next;
  }
  return short_list;
}

Assistant:

SinglyNodeWithRand* SinglyLinkedList::common_loop_intersection(si9ma::SinglyNodeWithRand *head1, si9ma::SinglyNodeWithRand *head2, si9ma::SinglyNodeWithRand *list_terminal) {
        int len = 0;

        auto *ptr = head1;
        while (ptr != list_terminal){
            len ++;
            ptr = ptr->next;
        }

        ptr = head2;
        while (ptr != list_terminal){
            len --;
            ptr = ptr->next;
        }

        auto *long_list = len > 0 ? head1 : head2;
        auto *short_list = len > 0 ? head2 : head1;
        int diff = abs(len);

        while (diff-- > 0)
            long_list = long_list->next;

        while (long_list != short_list){
            long_list = long_list->next;
            short_list = short_list->next;
        }

        return long_list;
    }